

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

void __thiscall ON_Layer::UnsetPerViewportPersistentVisibility(ON_Layer *this,ON_UUID viewport_id)

{
  bool bVar1;
  int iVar2;
  ON__LayerExtensions *pOVar3;
  ON__LayerPerViewSettings *pOVar4;
  undefined1 in_R9B;
  ON_UUID viewport_id_00;
  ON__LayerPerViewSettings *vp_settings;
  bool bCreate;
  int i;
  ON__LayerExtensions *ud;
  ON_Layer *this_local;
  ON_UUID viewport_id_local;
  
  viewport_id_local._0_8_ = viewport_id.Data4;
  this_local = viewport_id._0_8_;
  bVar1 = ON_UuidIsNil((ON_UUID *)&this_local);
  if (bVar1) {
    pOVar3 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
    if (pOVar3 != (ON__LayerExtensions *)0x0) {
      for (vp_settings._4_4_ = 0;
          iVar2 = ON_SimpleArray<ON__LayerPerViewSettings>::Count(&pOVar3->m_vp_settings),
          vp_settings._4_4_ < iVar2; vp_settings._4_4_ = vp_settings._4_4_ + 1) {
        pOVar4 = ON_SimpleArray<ON__LayerPerViewSettings>::operator[]
                           (&pOVar3->m_vp_settings,vp_settings._4_4_);
        pOVar4->m_persistent_visibility = '\0';
      }
    }
  }
  else {
    viewport_id_00.Data4[0] = '\0';
    viewport_id_00.Data4[1] = '\0';
    viewport_id_00.Data4[2] = '\0';
    viewport_id_00.Data4[3] = '\0';
    viewport_id_00.Data4[4] = '\0';
    viewport_id_00.Data4[5] = '\0';
    viewport_id_00.Data4[6] = '\0';
    viewport_id_00.Data4[7] = '\0';
    viewport_id_00.Data1 = viewport_id_local.Data1;
    viewport_id_00.Data2 = viewport_id_local.Data2;
    viewport_id_00.Data3 = viewport_id_local.Data3;
    pOVar4 = ON__LayerExtensions::ViewportSettings
                       ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                        (uchar *)this_local,viewport_id_00,(bool)in_R9B);
    if (pOVar4 != (ON__LayerPerViewSettings *)0x0) {
      pOVar4->m_persistent_visibility = '\0';
    }
  }
  return;
}

Assistant:

void ON_Layer::UnsetPerViewportPersistentVisibility( ON_UUID viewport_id )
{
  // added to fix bug 82587
  if ( ON_UuidIsNil(viewport_id) )
  {
    ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions( *this, &m_extension_bits, false );
    if ( 0 != ud )
    {
      for ( int i = 0; i < ud->m_vp_settings.Count(); i++ )
      {
        ud->m_vp_settings[i].m_persistent_visibility = 0;
      }
    }
  }
  else
  {
    bool bCreate = false; // This "false" is correct because the per viewport visibility
                          // setting needs to be in existence for this call to make any
                          // sense in the first place.
    ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, bCreate );
    if (vp_settings )
      vp_settings->m_persistent_visibility = 0;
  }
}